

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Execute<double,duckdb::hugeint_t,duckdb::ArgMinMaxState<double,duckdb::hugeint_t>>
               (ArgMinMaxState<double,_duckdb::hugeint_t> *state,double x_data,hugeint_t y_data,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  ArgMinMaxState<double,_duckdb::hugeint_t> *in_RSI;
  hugeint_t *in_RDI;
  hugeint_t *in_XMM0_Qa;
  idx_t in_stack_ffffffffffffffd0;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_RCX,in_stack_ffffffffffffffd0);
  if ((bVar1) &&
     (bVar1 = GreaterThan::Operation<duckdb::hugeint_t>((hugeint_t *)in_RSI,in_RDI), bVar1)) {
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_RCX,(idx_t)in_RDI);
    Assign<double,duckdb::hugeint_t,duckdb::ArgMinMaxState<double,duckdb::hugeint_t>>
              (in_RSI,(double *)in_RDI,in_XMM0_Qa,SUB81((ulong)in_RCX >> 0x38,0));
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}